

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

void deqp::gls::AttributeLocationTestUtil::runTest
               (TestContext *testCtx,RenderContext *renderCtx,
               vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *attributes,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *preAttachBind,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *preLinkBind,
               vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               *postLinkBind,bool relink,bool reattach,
               vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               *reattachAttributes)

{
  ostringstream *poVar1;
  mapped_type mVar2;
  pointer pBVar3;
  pointer pAVar4;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  *attributes_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  GLuint program;
  GLenum GVar8;
  undefined4 extraout_var;
  mapped_type *pmVar9;
  TestError *this;
  char *description;
  long lVar10;
  TestLog *pTVar11;
  long lVar12;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  *binds;
  int bindNdx;
  long lVar13;
  allocator<char> local_299;
  pair<unsigned_int,_unsigned_int> local_298;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  *local_290;
  TestLog *local_288;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  *local_280;
  int local_274;
  RenderContext *local_270;
  TestContext *local_268;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  *local_260;
  ScopedLogSection section;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  activeBindings;
  AttribType local_218;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [384];
  Functions *gl;
  
  local_288 = testCtx->m_log;
  local_298 = (pair<unsigned_int,_unsigned_int>)preAttachBind;
  local_290 = preLinkBind;
  local_280 = attributes;
  local_270 = renderCtx;
  local_268 = testCtx;
  local_260 = postLinkBind;
  iVar7 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  gl = (Functions *)CONCAT44(extraout_var,iVar7);
  activeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &activeBindings._M_t._M_impl.super__Rb_tree_header._M_header;
  activeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  activeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  activeBindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar10 = 0;
  lVar12 = 0x28;
  activeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       activeBindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar13 = 0;
      pBVar3 = (((_Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                  *)local_298)->_M_impl).super__Vector_impl_data._M_start,
      lVar13 < (int)(((long)(((_Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                               *)local_298)->_M_impl).super__Vector_impl_data._M_finish -
                     (long)pBVar3) / 0x28); lVar13 = lVar13 + 1) {
    mVar2 = *(mapped_type *)((long)&pBVar3->m_location + lVar10);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&activeBindings,
                          (key_type *)((long)&(pBVar3->m_attribute)._M_dataplus._M_p + lVar10));
    *pmVar9 = mVar2;
    lVar10 = lVar10 + 0x28;
  }
  lVar10 = 0;
  for (lVar13 = 0;
      pBVar3 = (local_290->
               super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar13 < (int)(((long)(local_290->
                            super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) / 0x28);
      lVar13 = lVar13 + 1) {
    mVar2 = *(mapped_type *)((long)&pBVar3->m_location + lVar10);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&activeBindings,
                          (key_type *)((long)&(pBVar3->m_attribute)._M_dataplus._M_p + lVar10));
    *pmVar9 = mVar2;
    lVar10 = lVar10 + 0x28;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"Attributes",(allocator<char> *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Attribute information",(allocator<char> *)&local_1f0);
  tcu::ScopedLogSection::ScopedLogSection(&section,local_288,(string *)local_1b0,&local_218.m_name);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)local_1b0);
  pTVar11 = local_268->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  for (lVar10 = 0;
      pAVar4 = (local_280->
               super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar10 < (int)((ulong)((long)(local_280->
                                   super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4) >> 7)
      ; lVar10 = lVar10 + 1) {
    local_1b0._0_8_ = pTVar11;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Type: ");
    AttribType::AttribType(&local_218,(AttribType *)((long)pAVar4 + lVar12 + -0x28));
    std::operator<<((ostream *)poVar1,(string *)&local_218);
    std::operator<<((ostream *)poVar1,", Name: ");
    std::operator<<((ostream *)poVar1,
                    (string *)((long)&(pAVar4->m_type).m_name._M_dataplus._M_p + lVar12));
    iVar7 = *(int *)((long)&(pAVar4->m_type).m_locationSize + lVar12);
    if (iVar7 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,glcts::fixed_sample_locations_values + 1,&local_299);
    }
    else {
      local_274 = iVar7;
      de::toString<int>(&local_1f0,&local_274);
      std::operator+(&local_1d0,", Layout location ",&local_1f0);
    }
    std::operator<<((ostream *)poVar1,(string *)&local_1d0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_1d0);
    if (iVar7 != -1) {
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    lVar12 = lVar12 + 0x80;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar11 = local_288;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = local_288;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Create program.");
  binds = local_260;
  attributes_00 = local_280;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  program = (*gl->createProgram)();
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"glCreateProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x2cf);
  if ((((_Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
         *)local_298)->_M_impl).super__Vector_impl_data._M_start !=
      (((_Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
         *)local_298)->_M_impl).super__Vector_impl_data._M_finish) {
    anon_unknown_1::bindAttributes
              (pTVar11,gl,program,
               (vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                *)local_298);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar11;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Create and attach shaders to program.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  bVar5 = anon_unknown_1::hasAttributeAliasing(attributes_00,&activeBindings);
  local_298 = anon_unknown_1::createAndAttachShaders(pTVar11,local_270,program,attributes_00,bVar5);
  if ((local_290->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (local_290->
      super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    anon_unknown_1::bindAttributes(pTVar11,gl,program,local_290);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar11;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Link program.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (*gl->linkProgram)(program);
  GVar8 = (*gl->getError)();
  glu::checkError(GVar8,"glLinkProgram()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                  ,0x2dd);
  anon_unknown_1::logProgram(pTVar11,gl,program);
  bVar5 = anon_unknown_1::getProgramLinkStatus(gl,program);
  if (bVar5) {
    bVar5 = anon_unknown_1::checkQuery(pTVar11,gl,program,attributes_00,&activeBindings);
    if ((binds->
        super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (binds->
        super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      anon_unknown_1::bindAttributes(pTVar11,gl,program,binds);
      bVar6 = anon_unknown_1::checkQuery(pTVar11,gl,program,attributes_00,&activeBindings);
      bVar5 = bVar5 && bVar6;
    }
    if (relink) {
      local_290 = (vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                   *)CONCAT71(local_290._1_7_,bVar5);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar11;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Relink program.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      (*gl->linkProgram)(program);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glLinkProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x2f1);
      anon_unknown_1::logProgram(pTVar11,gl,program);
      bVar5 = anon_unknown_1::getProgramLinkStatus(gl,program);
      if (!bVar5) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Program link failed","getProgramLinkStatus(gl, program)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                   ,0x2f4);
        goto LAB_01515bed;
      }
      lVar10 = 0;
      for (lVar12 = 0; pTVar11 = local_288,
          pBVar3 = (binds->
                   super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          lVar12 < (int)(((long)(binds->
                                super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) / 0x28);
          lVar12 = lVar12 + 1) {
        mVar2 = *(mapped_type *)((long)&pBVar3->m_location + lVar10);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator[](&activeBindings,
                              (key_type *)((long)&(pBVar3->m_attribute)._M_dataplus._M_p + lVar10));
        *pmVar9 = mVar2;
        lVar10 = lVar10 + 0x28;
        binds = local_260;
      }
      bVar5 = anon_unknown_1::checkQuery(local_288,gl,program,local_280,&activeBindings);
      bVar5 = (bool)((byte)local_290 & bVar5);
    }
    if (reattach) {
      (*gl->detachShader)(program,local_298.first);
      (*gl->detachShader)(program,local_298.second);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glDetachShader()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x301);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar11;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Create and attach shaders to program.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar6 = anon_unknown_1::hasAttributeAliasing(reattachAttributes,&activeBindings);
      anon_unknown_1::createAndAttachShaders(pTVar11,local_270,program,reattachAttributes,bVar6);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = pTVar11;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Relink program.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      (*gl->linkProgram)(program);
      GVar8 = (*gl->getError)();
      glu::checkError(GVar8,"glLinkProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                      ,0x308);
      anon_unknown_1::logProgram(pTVar11,gl,program);
      bVar6 = anon_unknown_1::getProgramLinkStatus(gl,program);
      if (!bVar6) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Program link failed","getProgramLinkStatus(gl, program)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                   ,0x30b);
        goto LAB_01515bed;
      }
      bVar6 = anon_unknown_1::checkQuery(pTVar11,gl,program,reattachAttributes,&activeBindings);
      bVar5 = (bool)(bVar5 & bVar6);
    }
    (*gl->deleteProgram)(program);
    GVar8 = (*gl->getError)();
    glu::checkError(GVar8,"glDeleteProgram()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
                    ,0x312);
    description = "Fail";
    if (bVar5 != false) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult(local_268,(uint)(bVar5 ^ 1),description);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&activeBindings._M_t);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Program link failed","getProgramLinkStatus(gl, program)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsAttributeLocationTests.cpp"
             ,0x2e0);
LAB_01515bed:
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void runTest (tcu::TestContext&			testCtx,
			glu::RenderContext&			renderCtx,
			const vector<Attribute>&	attributes,
			const vector<Bind>&			preAttachBind,
			const vector<Bind>&			preLinkBind,
			const vector<Bind>&			postLinkBind,
			bool						relink,
			bool						reattach = false,
			const vector<Attribute>&	reattachAttributes = vector<Attribute>())
{
	TestLog&					log			= testCtx.getLog();
	const glw::Functions&		gl			= renderCtx.getFunctions();
	deUint32					program		= 0;
	pair<deUint32, deUint32>	shaders;

	try
	{
		bool					isOk			= true;
		map<string, deUint32>	activeBindings;

		for (int bindNdx = 0; bindNdx < (int)preAttachBind.size(); bindNdx++)
			activeBindings[preAttachBind[bindNdx].getAttributeName()] = preAttachBind[bindNdx].getLocation();

		for (int bindNdx = 0; bindNdx < (int)preLinkBind.size(); bindNdx++)
			activeBindings[preLinkBind[bindNdx].getAttributeName()] = preLinkBind[bindNdx].getLocation();

		{
			tcu::ScopedLogSection section(log, "Attributes", "Attribute information");
			logAttributes(testCtx.getLog(), attributes);
		}

		log << TestLog::Message << "Create program." << TestLog::EndMessage;
		program = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram()");

		if (!preAttachBind.empty())
			bindAttributes(log, gl, program, preAttachBind);

		log << TestLog::Message << "Create and attach shaders to program." << TestLog::EndMessage;
		shaders = createAndAttachShaders(log, renderCtx, program, attributes, hasAttributeAliasing(attributes, activeBindings));

		if (!preLinkBind.empty())
			bindAttributes(log, gl, program, preLinkBind);

		log << TestLog::Message << "Link program." << TestLog::EndMessage;

		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

		logProgram(log, gl, program);
		TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

		if (!checkQuery(log, gl, program, attributes, activeBindings))
			isOk = false;

		if (!postLinkBind.empty())
		{
			bindAttributes(log, gl, program, postLinkBind);

			if (!checkQuery(log, gl, program, attributes, activeBindings))
				isOk = false;
		}

		if (relink)
		{
			log << TestLog::Message << "Relink program." << TestLog::EndMessage;
			gl.linkProgram(program);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

			logProgram(log, gl, program);
			TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

			for (int bindNdx = 0; bindNdx < (int)postLinkBind.size(); bindNdx++)
				activeBindings[postLinkBind[bindNdx].getAttributeName()] = postLinkBind[bindNdx].getLocation();

			if (!checkQuery(log, gl, program, attributes, activeBindings))
				isOk = false;
		}

		if (reattach)
		{
			gl.detachShader(program, shaders.first);
			gl.detachShader(program, shaders.second);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader()");

			log << TestLog::Message << "Create and attach shaders to program." << TestLog::EndMessage;
			createAndAttachShaders(log, renderCtx, program, reattachAttributes, hasAttributeAliasing(reattachAttributes, activeBindings));

			log << TestLog::Message << "Relink program." << TestLog::EndMessage;
			gl.linkProgram(program);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram()");

			logProgram(log, gl, program);
			TCU_CHECK_MSG(getProgramLinkStatus(gl, program), "Program link failed");

			if (!checkQuery(log, gl, program, reattachAttributes, activeBindings))
				isOk = false;
		}

		gl.deleteProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram()");

		if (isOk)
			testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	catch (...)
	{
		if (program)
			gl.deleteProgram(program);

		throw;
	}
}